

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O0

bool __thiscall
Catch::ConsoleReporter::assertionEnded(ConsoleReporter *this,AssertionStats *_assertionStats)

{
  bool bVar1;
  uint uVar2;
  OfType OVar3;
  byte local_dd;
  undefined1 local_d0 [8];
  ConsoleAssertionPrinter printer;
  bool includeResults;
  AssertionResult *result;
  AssertionStats *_assertionStats_local;
  ConsoleReporter *this_local;
  
  uVar2 = (*((this->super_StreamingReporterBase).m_config)->_vptr_IConfig[5])();
  local_dd = 1;
  if ((uVar2 & 1) == 0) {
    bVar1 = AssertionResult::isOk(&_assertionStats->assertionResult);
    local_dd = bVar1 ^ 0xff;
  }
  printer._159_1_ = local_dd & 1;
  if ((printer._159_1_ == 0) &&
     (OVar3 = AssertionResult::getResultType(&_assertionStats->assertionResult), OVar3 != Warning))
  {
    return false;
  }
  lazyPrint(this);
  anon_unknown_23::ConsoleAssertionPrinter::ConsoleAssertionPrinter
            ((ConsoleAssertionPrinter *)local_d0,(this->super_StreamingReporterBase).stream,
             _assertionStats,(bool)(printer._159_1_ & 1));
  anon_unknown_23::ConsoleAssertionPrinter::print((ConsoleAssertionPrinter *)local_d0);
  std::ostream::operator<<
            ((this->super_StreamingReporterBase).stream,std::endl<char,std::char_traits<char>>);
  anon_unknown_23::ConsoleAssertionPrinter::~ConsoleAssertionPrinter
            ((ConsoleAssertionPrinter *)local_d0);
  return true;
}

Assistant:

bool ConsoleReporter::assertionEnded(AssertionStats const &_assertionStats) {
                AssertionResult const &result = _assertionStats.assertionResult;

                bool includeResults = m_config->includeSuccessfulResults() || !result.isOk();

                // Drop out if result was successful but we're not printing them.
                if (!includeResults && result.getResultType() != ResultWas::Warning)
                    return false;

                lazyPrint();

                ConsoleAssertionPrinter printer(stream, _assertionStats, includeResults);
                printer.print();
                stream << std::endl;
                return true;
            }